

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O2

string * __thiscall
Liby::http::Request::toString_abi_cxx11_(string *__return_storage_ptr__,Request *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  char *__first;
  char *pcVar3;
  off_t oVar4;
  __node_base *p_Var5;
  Buffer *this_00;
  
  pmVar2 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&methods_string_abi_cxx11_,&this->method_);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  if ((this->query_)._M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  p_Var5 = &(this->headers_)._M_h._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  this_00 = &this->body_;
  bVar1 = Buffer::empty(this_00);
  if (!bVar1) {
    __first = Buffer::data(this_00);
    pcVar3 = Buffer::data(this_00);
    oVar4 = Buffer::size(this_00);
    std::__cxx11::string::append<char*,void>
              ((string *)__return_storage_ptr__,__first,pcVar3 + oVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Request::toString() {
    std::string ret = methods_string[method_];
    ret += " ";
    ret += uri_;
    if (!query_.empty()) {
        ret += "?";
        ret += query_;
    }
    ret += " HTTP/1.1\r\n";
    for (auto &header : headers_) {
        ret += header.first;
        ret += ": ";
        ret += header.second;
        ret += "\r\n";
    }
    ret += "\r\n";
    if (!body_.empty()) {
        ret.append(body_.data(), body_.data() + body_.size());
    }
    return ret;
}